

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestaccessmanager_p.h
# Opt level: O3

QNetworkReply * __thiscall
QRestAccessManagerPrivate::executeRequest
          (QRestAccessManagerPrivate *this,ReqOpRef requestOperation,QObject *context,
          QSlotObjectBase *rawSlot)

{
  QNetworkReply *reply;
  long in_FS_OFFSET;
  QSlotObjectBase *local_40;
  QNetworkReply *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->qnam == (QNetworkAccessManager *)0x0) {
    executeRequest();
    reply = local_38;
  }
  else {
    verifyThreadAffinity(this,context);
    local_38 = (QNetworkReply *)this->qnam;
    reply = (*requestOperation.
              super_function_ref_base<false,_const_void,_QNetworkReply_*,_QNetworkAccessManager_*>.
              m_thunk_ptr)(requestOperation.
                           super_function_ref_base<false,_const_void,_QNetworkReply_*,_QNetworkAccessManager_*>
                           .m_bound_entity,(QNetworkAccessManager **)&local_38);
    local_40 = rawSlot;
    createActiveRequest(this,reply,context,(SlotObjUniquePtr)&local_40);
    if (local_40 != (QSlotObjectBase *)0x0) {
      LOCK();
      (local_40->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (local_40->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*local_40->m_impl)(0,local_40,(QObject *)0x0,(void **)0x0,(bool *)0x0);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return reply;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReply *executeRequest(ReqOpRef requestOperation,
                                  const QObject *context, QtPrivate::QSlotObjectBase *rawSlot)
    {
        QtPrivate::SlotObjUniquePtr slot(rawSlot);
        if (!qnam)
            return warnNoAccessManager();
        verifyThreadAffinity(context);
        QNetworkReply *reply = requestOperation(qnam);
        return createActiveRequest(reply, context, std::move(slot));
    }